

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O1

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_handle_t *puVar3;
  undefined8 *extraout_RDX;
  code *pcVar4;
  undefined8 *puVar5;
  uv_udp_t *puVar6;
  int64_t eval_b_13;
  int64_t eval_b_14;
  sockaddr_in addr;
  sockaddr_in addr3;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  undefined1 auStack_5a8 [40];
  code *pcStack_580;
  undefined8 uStack_570;
  undefined1 auStack_568 [16];
  undefined1 local_558 [8];
  uv_handle_t *local_550;
  sockaddr_in local_548;
  undefined1 local_538 [32];
  sockaddr_in local_518;
  uv_udp_send_t local_508;
  uv_udp_send_t local_3c8;
  uv_udp_send_t local_288;
  uv_udp_send_t local_148;
  
  can_recverr = '\x01';
  local_3c8.data = (void *)0x0;
  auStack_568._8_8_ = (uv_loop_t *)0x188809;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_558 + 0x10));
  local_508.data = (void *)(long)iVar1;
  if (local_3c8.data == local_508.data) {
    local_3c8.data = (void *)0x0;
    auStack_568._8_8_ = (uv_loop_t *)0x188845;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,&local_518);
    local_508.data = (void *)(long)iVar1;
    if (local_3c8.data != local_508.data) goto LAB_00188d2d;
    local_3c8.data = (void *)0x0;
    auStack_568._8_8_ = (uv_loop_t *)0x188881;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,(sockaddr_in *)(local_538 + 0x10));
    local_508.data = (void *)(long)iVar1;
    if (local_3c8.data != local_508.data) goto LAB_00188d3f;
    auStack_568._8_8_ = (uv_loop_t *)0x1888a0;
    puVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x1888af;
    iVar1 = uv_timer_init(puVar2,&timer);
    local_3c8.data = (void *)(long)iVar1;
    local_508.data = (void *)0x0;
    if (local_3c8.data != (void *)0x0) goto LAB_00188d51;
    auStack_568._8_8_ = (uv_loop_t *)0x1888ef;
    iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
    local_3c8.data = (void *)(long)iVar1;
    local_508.data = (void *)0x0;
    if (local_3c8.data != (void *)0x0) goto LAB_00188d63;
    auStack_568._8_8_ = (uv_loop_t *)0x18891a;
    puVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x188929;
    iVar1 = uv_udp_init(puVar2,&client);
    local_3c8.data = (void *)(long)iVar1;
    local_508.data = (void *)0x0;
    if (local_3c8.data != (void *)0x0) goto LAB_00188d75;
    auStack_568._8_8_ = (uv_loop_t *)0x188962;
    iVar1 = uv_udp_bind(&client,(sockaddr *)&local_518,0);
    local_3c8.data = (void *)(long)iVar1;
    local_508.data = (void *)0x0;
    if (local_3c8.data != (void *)0x0) goto LAB_00188d87;
    auStack_568._8_8_ = (uv_loop_t *)0x1889a2;
    iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
    local_3c8.data = (void *)(long)iVar1;
    local_508.data = (void *)0x0;
    if (local_3c8.data != (void *)0x0) goto LAB_00188d99;
    auStack_568._8_8_ = (uv_loop_t *)0x1889d9;
    local_538._0_16_ = (undefined1  [16])uv_buf_init("PING",4);
    auStack_568._8_8_ = (uv_loop_t *)0x188a0d;
    iVar1 = uv_udp_send(&local_3c8,&client,(uv_buf_t *)local_538,1,(sockaddr *)(local_558 + 0x10),
                        send_cb);
    local_508.data = (void *)(long)iVar1;
    local_148.data = (void *)0x0;
    if (local_508.data != (void *)0x0) goto LAB_00188dab;
    auStack_568._8_8_ = (uv_loop_t *)0x188a44;
    local_538._0_16_ = (undefined1  [16])uv_buf_init("PANG",4);
    auStack_568._8_8_ = (uv_loop_t *)0x188a75;
    iVar1 = uv_udp_send(&local_508,&client,(uv_buf_t *)local_538,1,(sockaddr *)(local_558 + 0x10),
                        send_cb);
    local_148.data = (void *)(long)iVar1;
    local_288.data = (void *)0x0;
    if (local_148.data != (void *)0x0) goto LAB_00188dbd;
    auStack_568._8_8_ = (uv_loop_t *)0x188aa6;
    puVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x188ab5;
    iVar1 = uv_udp_init(puVar2,&client2);
    local_148.data = (void *)(long)iVar1;
    local_288.data = (void *)0x0;
    if (local_148.data != (void *)0x0) goto LAB_00188dd2;
    auStack_568._8_8_ = (uv_loop_t *)0x188af7;
    iVar1 = uv_udp_bind(&client2,(sockaddr *)(local_538 + 0x10),0x20);
    local_148.data = (void *)(long)iVar1;
    local_288.data = (void *)0x0;
    if (local_148.data != (void *)0x0) goto LAB_00188de7;
    auStack_568._8_8_ = (uv_loop_t *)0x188b3d;
    iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
    local_148.data = (void *)(long)iVar1;
    local_288.data = (void *)0x0;
    if (local_148.data != (void *)0x0) goto LAB_00188dfc;
    auStack_568._8_8_ = (uv_loop_t *)0x188b7a;
    local_538._0_16_ = (undefined1  [16])uv_buf_init("PING",4);
    auStack_568._8_8_ = (uv_loop_t *)0x188bae;
    iVar1 = uv_udp_send(&local_148,&client2,(uv_buf_t *)local_538,1,(sockaddr *)(local_558 + 0x10),
                        send_cb_recverr);
    local_288.data = (void *)(long)iVar1;
    local_558 = (undefined1  [8])0x0;
    if (local_288.data != (void *)0x0) goto LAB_00188e11;
    auStack_568._8_8_ = (uv_loop_t *)0x188be3;
    local_538._0_16_ = (undefined1  [16])uv_buf_init("PANG",4);
    auStack_568._8_8_ = (uv_loop_t *)0x188c17;
    iVar1 = uv_udp_send(&local_288,&client2,(uv_buf_t *)local_538,1,(sockaddr *)(local_558 + 0x10),
                        send_cb_recverr);
    local_558 = (undefined1  [8])(long)iVar1;
    local_550 = (uv_handle_t *)0x0;
    if (local_558 != (undefined1  [8])0x0) goto LAB_00188e21;
    auStack_568._8_8_ = (uv_loop_t *)0x188c3a;
    puVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x188c44;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_558 = (undefined1  [8])(long)send_cb_called;
    local_550 = (uv_handle_t *)0x4;
    if (local_558 != (undefined1  [8])0x4) goto LAB_00188e2e;
    local_558 = (undefined1  [8])(long)recv_cb_called;
    local_550 = (uv_handle_t *)(long)alloc_cb_called;
    if (local_558 != (undefined1  [8])local_550) goto LAB_00188e3b;
    local_558 = (undefined1  [8])(long)timer_cb_called;
    local_550 = (uv_handle_t *)0x1;
    if (local_558 != (undefined1  [8])0x1) goto LAB_00188e48;
    local_558 = (undefined1  [8])(long)close_cb_called;
    local_550 = (uv_handle_t *)0x3;
    if (local_558 != (undefined1  [8])0x3) goto LAB_00188e55;
    auStack_568._8_8_ = (uv_loop_t *)0x188cd8;
    puVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x188cec;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcVar4 = (code *)0x0;
    auStack_568._8_8_ = (uv_loop_t *)0x188cf6;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_568._8_8_ = (uv_loop_t *)0x188cfb;
    puVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x188d03;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      auStack_568._8_8_ = (uv_loop_t *)0x188d10;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_568._8_8_ = (uv_loop_t *)0x188d2d;
    run_test_udp_send_unreachable_cold_1();
LAB_00188d2d:
    auStack_568._8_8_ = (uv_loop_t *)0x188d3f;
    run_test_udp_send_unreachable_cold_2();
LAB_00188d3f:
    auStack_568._8_8_ = (uv_loop_t *)0x188d51;
    run_test_udp_send_unreachable_cold_3();
LAB_00188d51:
    auStack_568._8_8_ = (uv_loop_t *)0x188d63;
    run_test_udp_send_unreachable_cold_4();
LAB_00188d63:
    auStack_568._8_8_ = (uv_loop_t *)0x188d75;
    run_test_udp_send_unreachable_cold_5();
LAB_00188d75:
    auStack_568._8_8_ = (uv_loop_t *)0x188d87;
    run_test_udp_send_unreachable_cold_6();
LAB_00188d87:
    auStack_568._8_8_ = (uv_loop_t *)0x188d99;
    run_test_udp_send_unreachable_cold_7();
LAB_00188d99:
    auStack_568._8_8_ = (uv_loop_t *)0x188dab;
    run_test_udp_send_unreachable_cold_8();
LAB_00188dab:
    auStack_568._8_8_ = (uv_loop_t *)0x188dbd;
    run_test_udp_send_unreachable_cold_9();
LAB_00188dbd:
    auStack_568._8_8_ = (uv_loop_t *)0x188dd2;
    run_test_udp_send_unreachable_cold_10();
LAB_00188dd2:
    auStack_568._8_8_ = (uv_loop_t *)0x188de7;
    run_test_udp_send_unreachable_cold_11();
LAB_00188de7:
    auStack_568._8_8_ = (uv_loop_t *)0x188dfc;
    run_test_udp_send_unreachable_cold_12();
LAB_00188dfc:
    auStack_568._8_8_ = (uv_loop_t *)0x188e11;
    run_test_udp_send_unreachable_cold_13();
LAB_00188e11:
    auStack_568._8_8_ = (uv_loop_t *)0x188e21;
    run_test_udp_send_unreachable_cold_14();
LAB_00188e21:
    auStack_568._8_8_ = (uv_loop_t *)0x188e2e;
    run_test_udp_send_unreachable_cold_15();
LAB_00188e2e:
    auStack_568._8_8_ = (uv_loop_t *)0x188e3b;
    run_test_udp_send_unreachable_cold_16();
LAB_00188e3b:
    auStack_568._8_8_ = (uv_loop_t *)0x188e48;
    run_test_udp_send_unreachable_cold_17();
LAB_00188e48:
    auStack_568._8_8_ = (uv_loop_t *)0x188e55;
    run_test_udp_send_unreachable_cold_18();
LAB_00188e55:
    puVar2 = (uv_loop_t *)local_558;
    pcVar4 = (code *)(local_558 + 8);
    auStack_568._8_8_ = (uv_loop_t *)0x188e62;
    run_test_udp_send_unreachable_cold_19();
  }
  auStack_568._8_8_ = timer_cb;
  run_test_udp_send_unreachable_cold_20();
  if (puVar2 == (uv_loop_t *)&timer) {
    timer_cb_called = timer_cb_called + 1;
    auStack_568._0_8_ = (void *)0x188e8d;
    uv_close((uv_handle_t *)&client,close_cb);
    if (can_recverr == '\x01') {
      auStack_568._0_8_ = (void *)0x188ea9;
      uv_close((uv_handle_t *)&client2,close_cb);
    }
    uv_close((uv_handle_t *)&timer,close_cb);
    return extraout_EAX;
  }
  auStack_568._0_8_ = alloc_cb;
  timer_cb_cold_1();
  puVar3 = (uv_handle_t *)
           CONCAT71(0x5cad,puVar2 == (uv_loop_t *)&client2 || puVar2 == (uv_loop_t *)&client);
  if (puVar2 == (uv_loop_t *)&client2 || puVar2 == (uv_loop_t *)&client) {
    uStack_570 = (void *)0x10000;
    auStack_568._0_8_ = pcVar4;
    if ((long)pcVar4 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      alloc_cb_called = alloc_cb_called + 1;
      return 0x5cae30;
    }
  }
  else {
    pcStack_580 = (code *)0x188f20;
    alloc_cb_cold_1();
  }
  puVar6 = (uv_udp_t *)auStack_568;
  puVar5 = &uStack_570;
  pcStack_580 = recv_cb;
  alloc_cb_cold_2();
  if (puVar6 == &client2 || puVar6 == &client) {
    recv_cb_called = recv_cb_called + 1;
    if ((long)puVar5 < 0) goto LAB_00188f71;
    pcStack_580._0_4_ = extraout_EAX_00;
    if (puVar5 != (undefined8 *)0x0) {
      if (puVar3 != (uv_handle_t *)0x0) {
        return extraout_EAX_00;
      }
      auStack_5a8._32_8_ = (void *)0x188f65;
      recv_cb_cold_2();
    }
    iVar1 = (int)puVar5;
    if (puVar3 == (uv_handle_t *)0x0) {
      return (int)pcStack_580;
    }
  }
  else {
    auStack_5a8._32_8_ = (void *)0x188f71;
    recv_cb_cold_1();
LAB_00188f71:
    iVar1 = (int)puVar5;
    auStack_5a8._32_8_ = (void *)0x188f76;
    recv_cb_cold_4();
  }
  auStack_5a8._32_8_ = send_cb;
  recv_cb_cold_3();
  if (puVar3 == (uv_handle_t *)0x0) {
    auStack_5a8._8_8_ = (uv_loop_t *)0x188fd5;
    send_cb_cold_4();
LAB_00188fd5:
    auStack_5a8._8_8_ = (uv_loop_t *)0x188fda;
    send_cb_cold_1();
    puVar3 = (uv_handle_t *)(auStack_5a8 + 0x20);
    iVar1 = (int)auStack_5a8 + 0x18;
    auStack_5a8._8_8_ = (uv_loop_t *)0x188fe9;
    send_cb_cold_2();
  }
  else {
    if (iVar1 != 0) goto LAB_00188fd5;
    auStack_5a8._32_8_ = (code *)0x0;
    auStack_5a8._24_8_ = (uv_close_cb)0x0;
    puVar6 = (uv_udp_t *)(puVar3->u).reserved[2];
    iVar1 = 0;
    if (puVar6 == &client2 || puVar6 == &client) {
      send_cb_called = send_cb_called + 1;
      return (int)CONCAT71((int7)((ulong)puVar6 >> 8),puVar6 == &client2 || puVar6 == &client);
    }
  }
  auStack_5a8._8_8_ = send_cb_recverr;
  send_cb_cold_3();
  if (puVar3 == (uv_handle_t *)0x0) {
    auStack_5a8._0_8_ = (void *)0x18902c;
    send_cb_recverr_cold_3();
  }
  else {
    if ((iVar1 != -0x6f) && (iVar1 != 0)) goto LAB_00189031;
    if ((uv_udp_t *)(puVar3->u).reserved[2] == &client2 ||
        (uv_udp_t *)(puVar3->u).reserved[2] == &client) {
      send_cb_called = send_cb_called + 1;
      return extraout_EAX_01;
    }
  }
  auStack_5a8._0_8_ = (void *)0x189031;
  send_cb_recverr_cold_1();
LAB_00189031:
  auStack_5a8._0_8_ = close_cb;
  send_cb_recverr_cold_2();
  auStack_5a8._0_8_ = (void *)0x1;
  iVar1 = uv_is_closing(puVar3);
  if ((void *)auStack_5a8._0_8_ == (void *)(long)iVar1) {
    close_cb_called = close_cb_called + 1;
    return (int)auStack_5a8._0_8_;
  }
  puVar3 = (uv_handle_t *)auStack_5a8;
  close_cb_cold_1();
  iVar1 = uv_is_closing(puVar3);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(puVar3,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_EQ(r, 0);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_EQ(r, 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_EQ(r, 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_EQ(r, 0);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_EQ(r, 0);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_EQ(r, 0);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_EQ(r, 0);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(timer_cb_called, 1);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY();
  return 0;
}